

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::_InternalSerialize
          (TensorValue_RepeatedStrings *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  size_t __n;
  Type *s;
  ulong uVar1;
  uint8_t *puVar2;
  int index;
  int iVar3;
  
  iVar3 = (this->values_).super_RepeatedPtrFieldBase.current_size_;
  index = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
    index = 0;
  }
  for (; iVar3 != index; index = index + 1) {
    s = google::protobuf::internal::RepeatedPtrFieldBase::
        Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  (&(this->values_).super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((s->_M_dataplus)._M_p,(int)s->_M_string_length,SERIALIZE,
               "CoreML.Specification.MILSpec.TensorValue.RepeatedStrings.values");
    __n = s->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = '\n';
      target[1] = (uint8_t)__n;
      memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
      target = target + __n + 2;
    }
    else {
      target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,target);
    }
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  uVar1 = uVar1 & 0xfffffffffffffffc;
  puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar1 + 8),*(int *)(uVar1 + 0x10),target);
  return puVar2;
}

Assistant:

uint8_t* TensorValue_RepeatedStrings::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.TensorValue.RepeatedStrings)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string values = 1;
  for (int i = 0, n = this->_internal_values_size(); i < n; i++) {
    const auto& s = this->_internal_values(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.TensorValue.RepeatedStrings.values");
    target = stream->WriteString(1, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.TensorValue.RepeatedStrings)
  return target;
}